

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_groups.cxx
# Opt level: O1

void __thiscall xray_re::xr_group_object::load(xr_group_object *this,xr_reader *r)

{
  uint *puVar1;
  size_t sVar2;
  ulong __n;
  uint16_t version;
  short local_52;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar2 = xr_reader::r_raw_chunk(r,0,&local_52,2);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_groups.cxx"
                  ,0x12,"virtual void xray_re::xr_group_object::load(xr_reader &)");
  }
  if (local_52 == 0x11) {
    xr_custom_object::load(&this->super_xr_custom_object,r);
    xr_reader::r_raw_chunk(r,3,&(this->super_xr_custom_object).field_0x6c,4);
    if (((this->super_xr_custom_object).field_0x6c & 1) == 0) {
      xr_scene::load_objects((this->super_xr_custom_object).m_scene,r,1,&this->m_objects);
    }
    else {
      sVar2 = xr_reader::find_chunk(r,5);
      if (sVar2 != 0) {
        puVar1 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
        __n = (ulong)*puVar1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->m_open_objects,__n);
        if (__n != 0) {
          do {
            local_50._M_string_length = 0;
            local_50.field_2._M_local_buf[0] = '\0';
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->m_open_objects,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,
                              CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                       local_50.field_2._M_local_buf[0]) + 1);
            }
            __n = __n - 1;
            xr_reader::r_sz(r,(this->m_open_objects).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1);
          } while (__n != 0);
        }
      }
    }
    if (((this->m_objects).
         super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->m_objects).
         super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((this->m_open_objects).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_open_objects).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      __assert_fail("!m_objects.empty() || !m_open_objects.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_groups.cxx"
                    ,0x1c,"virtual void xray_re::xr_group_object::load(xr_reader &)");
    }
    sVar2 = xr_reader::find_chunk(r,4);
    if (sVar2 != 0) {
      xr_reader::r_sz(r,&this->m_reference);
    }
    return;
  }
  __assert_fail("version == GROUPOBJ_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_groups.cxx"
                ,0x13,"virtual void xray_re::xr_group_object::load(xr_reader &)");
}

Assistant:

void xr_group_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(GROUPOBJ_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == GROUPOBJ_VERSION);
	xr_custom_object::load(r);
	r.r_chunk<uint32_t>(GROUPOBJ_CHUNK_FLAGS, m_flags);
	if (m_flags & GOF_OPEN) {
		if (r.find_chunk(GROUPOBJ_CHUNK_OPEN_OBJECT_LIST))
			r.r_seq(r.r_u32(), m_open_objects, xr_reader::f_r_sz());
	} else {
		scene().load_objects(r, GROUPOBJ_CHUNK_OBJECTS, m_objects);
	}
	xr_assert(!m_objects.empty() || !m_open_objects.empty());
	if (r.find_chunk(GROUPOBJ_CHUNK_REFERENCE)) {
		r.r_sz(m_reference);
		r.debug_find_chunk();
	}
}